

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O2

void fl_measure(char *str,int *w,int *h,int draw_symbols)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  double width;
  char *linebuf;
  int buflen;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    *w = 0;
    *h = 0;
    return;
  }
  iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  *h = iVar3;
  linebuf = (char *)0x0;
  width = 0.0;
  iVar7 = 0;
  if (draw_symbols == 0) {
    iVar4 = 0;
    iVar5 = 0;
  }
  else {
    if (*str == '@') {
      if (str[1] == '@') {
        pcVar6 = str + (ulong)(str[1] == '@') * 2;
        iVar4 = 0;
      }
      else {
        cVar2 = '@';
        while (cVar2 != '\0') {
          iVar5 = (int)cVar2;
          iVar4 = isspace(iVar5);
          if (iVar4 != 0) goto LAB_00197850;
          pcVar6 = str + 1;
          str = str + 1;
          cVar2 = *pcVar6;
        }
        iVar5 = 0;
LAB_00197850:
        iVar4 = isspace(iVar5);
        str = str + (iVar4 != 0);
        pcVar6 = str;
        iVar4 = iVar3;
      }
    }
    else {
      iVar4 = 0;
      pcVar6 = str;
    }
    pcVar6 = strchr(pcVar6,0x40);
    iVar5 = 0;
    if ((pcVar6 != (char *)0x0) && (iVar5 = iVar3, pcVar6[1] == '@')) {
      iVar5 = 0;
    }
  }
  iVar3 = 1;
  do {
    str = expand_text_(str,&linebuf,0,(double)(*w - (iVar5 + iVar4)),&buflen,&width,(uint)(*w != 0),
                       draw_symbols);
    dVar9 = ceil(width);
    iVar1 = (int)dVar9;
    if ((int)dVar9 < iVar7) {
      iVar1 = iVar7;
    }
    iVar7 = iVar1;
    if (*str == '@') {
      if ((draw_symbols != 0) && (str[1] != '@')) {
LAB_00197910:
        if (iVar4 != 0 || iVar5 != 0) {
          bVar8 = iVar4 != 0;
          iVar4 = 0;
          if (bVar8) {
            iVar4 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
            iVar4 = iVar4 * iVar3;
          }
          if (iVar5 == 0) {
            iVar5 = 0;
          }
          else {
            iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
            iVar5 = iVar5 * iVar3;
          }
        }
        *w = iVar5 + iVar4 + iVar7;
        *h = iVar3 * *h;
        return;
      }
    }
    else if (*str == '\0') goto LAB_00197910;
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void fl_measure(const char* str, int& w, int& h, int draw_symbols) {
  if (!str || !*str) {w = 0; h = 0; return;}
  h = fl_height();
  char *linebuf = NULL;
  const char* p;
  const char* e;
  int buflen;
  int lines;
  double width=0;
  int W = 0;
  int symwidth[2], symtotal;

  symwidth[0] = 0;	// size of symbol at beginning of string (if any)
  symwidth[1] = 0;	// size of symbol at end of string (if any)

  if (draw_symbols) {
    // Symbol at beginning of string?
    const char *sym2 = (str[0]=='@' && str[1]=='@') ? str+2 : str;	// sym2 check will skip leading @@
    if (str[0] == '@' && str[1] != '@') {
      while (*str && !isspace(*str)) { ++str; }		// skip over symbol
      if (isspace(*str)) ++str;				// skip over trailing space
      sym2 = str;					// sym2 check will skip leading symbol
      symwidth[0] = h;
    }
    // Symbol at end of string?
    if ((p=strchr(sym2,'@')) != NULL && p[1] != '@') {
      symwidth[1] = h;
    }
  }

  symtotal = symwidth[0] + symwidth[1];

  for (p = str, lines=0; p;) {
//    e = expand(p, linebuf, w - symtotal, buflen, width, w != 0, draw_symbols);
    e = expand_text_(p, linebuf, 0, w - symtotal, buflen, width,
			w != 0, draw_symbols);
    if ((int)ceil(width) > W) W = (int)ceil(width);
    lines++;
    if (!*e || (*e == '@' && e[1] != '@' && draw_symbols)) break;
    p = e;
  }

  if ((symwidth[0] || symwidth[1]) && lines) {
    if (symwidth[0]) symwidth[0] = lines * fl_height();
    if (symwidth[1]) symwidth[1] = lines * fl_height();
  }

  symtotal = symwidth[0] + symwidth[1];

  w = W + symtotal;
  h = lines*h;
}